

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O1

bool docio_check_buffer(docio_handle *handle,bid_t bid,uint64_t sb_bmp_revnum)

{
  err_log_callback *log_callback;
  bool bVar1;
  fdb_status status;
  int iVar2;
  uint64_t uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  log_callback = handle->log_callback;
  if (handle->lastbid != 0xffffffffffffffff) {
    uVar3 = filemgr_get_sb_bmp_revnum(handle->file);
    if (uVar3 != handle->lastBmpRevnum) {
      handle->lastbid = 0xffffffffffffffff;
    }
  }
  if (handle->lastbid != bid) {
    status = filemgr_read(handle->file,bid,handle->readbuffer,log_callback,true);
    if (status == FDB_RESULT_SUCCESS) {
      iVar2 = filemgr_is_writable(handle->file,bid);
      if (iVar2 == 0) {
        handle->lastbid = bid;
        uVar3 = filemgr_get_sb_bmp_revnum(handle->file);
        handle->lastBmpRevnum = uVar3;
        goto LAB_001211ba;
      }
    }
    else {
      fdb_log_impl(log_callback,2,status,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"_docio_read_through_buffer",0x2cc,
                   "Error in reading a doc block with id %lu from a database file \'%s\'",bid,
                   handle->file->filename);
    }
    handle->lastbid = 0xffffffffffffffff;
  }
LAB_001211ba:
  uVar5 = (ulong)handle->file->blocksize;
  bVar1 = ver_non_consecutive_doc(handle->file->version);
  uVar4 = 0;
  if (bVar1) {
    uVar4 = (uint)*(ushort *)((long)handle->readbuffer + (uVar5 - 8));
  }
  if (*(char *)((long)handle->readbuffer + (uVar5 - 1)) == -0x23) {
    bVar6 = true;
    if (bVar1 && sb_bmp_revnum != 0xffffffffffffffff) {
      bVar6 = ((uint)sb_bmp_revnum & 0xffff) == ((uVar4 & 0xff00) << 8 | uVar4 << 0x18) >> 0x10;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool docio_check_buffer(struct docio_handle *handle,
                        bid_t bid,
                        uint64_t sb_bmp_revnum)
{
    err_log_callback *log_callback = handle->log_callback;
    _docio_read_through_buffer(handle, bid, log_callback, true);
    return _docio_check_buffer(handle, sb_bmp_revnum);
}